

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O2

void __thiscall
Assimp::FBXExporter::WriteModelNode
          (FBXExporter *this,StreamWriterLE *outstream,bool binary,aiNode *node,int64_t node_uid,
          string *type,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain,TransformInheritance inherit_type)

{
  pointer ppVar1;
  int iVar2;
  const_iterator cVar3;
  DeadlyImportError *this_00;
  undefined7 in_register_00000011;
  _Base_ptr name_00;
  pointer __k;
  allocator<char> local_3d4;
  allocator<char> local_3d3;
  allocator<char> local_3d2;
  allocator<char> local_3d1;
  string local_3d0;
  aiVector3t<float> local_3b0;
  aiVector3t<float> local_3a0;
  aiVector3t<float> local_390;
  undefined4 local_384;
  string local_380;
  string local_360;
  StreamWriterLE *local_340;
  stringstream err;
  ostream local_328 [376];
  FBXExportProperty local_1b0;
  FBXExportProperty local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string name;
  Node p;
  Node m;
  
  local_384 = (undefined4)CONCAT71(in_register_00000011,binary);
  local_340 = outstream;
  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Model",(allocator<char> *)&p);
  FBX::Node::Node(&m,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 (node->mName).data,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_);
  std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err,
                 "Model");
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string((string *)&local_150,(string *)&name);
  std::__cxx11::string::string((string *)&local_170,(string *)type);
  FBX::Node::AddProperties<long,std::__cxx11::string,std::__cxx11::string>
            (&m,node_uid,&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Version",(allocator<char> *)&p)
  ;
  FBX::Node::AddChild<int>(&m,(string *)&err,0xe8);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"Properties70",(allocator<char> *)&local_3d0);
  FBX::Node::Node(&p,(string *)&err);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"RotationActive",(allocator<char> *)&local_3d0);
  FBX::Node::AddP70bool(&p,(string *)&err,true);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"DefaultAttributeIndex",(allocator<char> *)&local_3d0);
  FBX::Node::AddP70int(&p,(string *)&err,0);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"InheritType",(allocator<char> *)&local_3d0);
  FBX::Node::AddP70enum(&p,(string *)&err,inherit_type);
  std::__cxx11::string::~string((string *)&err);
  __k = (transform_chain->
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (transform_chain->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k == ppVar1) {
    local_390.x = 0.0;
    local_390.y = 0.0;
    local_390.z = 0.0;
    local_3a0.x = 0.0;
    local_3a0.y = 0.0;
    local_3a0.z = 0.0;
    local_3b0.x = 0.0;
    local_3b0.y = 0.0;
    local_3b0.z = 0.0;
    aiMatrix4x4t<float>::Decompose(&node->mTransformation,&local_3b0,&local_3a0,&local_390);
    if (((((local_390.x != 0.0) || (NAN(local_390.x))) || (local_390.y != 0.0)) ||
        ((NAN(local_390.y) || (local_390.z != 0.0)))) || (NAN(local_390.z))) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&err,"Lcl Translation",&local_3d1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Lcl Translation",&local_3d2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3d3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"A",&local_3d4);
      FBX::Node::AddP70<double,double,double>
                (&p,(string *)&err,&local_3d0,&local_360,&local_380,(double)local_390.x,
                 (double)local_390.y,(double)local_390.z);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&err);
    }
    if (((local_3a0.x != 0.0) || (NAN(local_3a0.x))) ||
       ((local_3a0.y != 0.0 || (((NAN(local_3a0.y) || (local_3a0.z != 0.0)) || (NAN(local_3a0.z)))))
       )) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Lcl Rotation",&local_3d1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Lcl Rotation",&local_3d2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3d3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"A",&local_3d4);
      FBX::Node::AddP70<double,double,double>
                (&p,(string *)&err,&local_3d0,&local_360,&local_380,(double)(local_3a0.x * 57.29578)
                 ,(double)(local_3a0.y * 57.29578),(double)(local_3a0.z * 57.29578));
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&err);
    }
    if ((((local_3b0.x != 1.0) || (NAN(local_3b0.x))) ||
        ((local_3b0.y != 1.0 || ((NAN(local_3b0.y) || (local_3b0.z != 1.0)))))) ||
       (NAN(local_3b0.z))) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&err,"Lcl Scaling",&local_3d1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Lcl Scaling",&local_3d2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_360,"",&local_3d3);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"A",&local_3d4);
      FBX::Node::AddP70<double,double,double>
                (&p,(string *)&err,&local_3d0,&local_360,&local_380,(double)local_3b0.x,
                 (double)local_3b0.y,(double)local_3b0.z);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_360);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::__cxx11::string::~string((string *)&err);
    }
  }
  else {
    for (; __k != ppVar1; __k = __k + 1) {
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
              ::find(&transform_types_abi_cxx11_._M_t,&__k->first);
      if ((_Rb_tree_header *)cVar3._M_node ==
          &transform_types_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::stringstream::stringstream((stringstream *)&err);
        std::operator<<(local_328,"unrecognized FBX transformation type: ");
        std::operator<<(local_328,(string *)__k);
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        DeadlyImportError::DeadlyImportError(this_00,&local_3d0);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      name_00 = cVar3._M_node + 2;
      iVar2 = std::__cxx11::string::compare((ulong)name_00,0,(char *)0x4);
      if (iVar2 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&err,"",(allocator<char> *)&local_360);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"A",(allocator<char> *)&local_380);
        FBX::Node::AddP70<double,double,double>
                  (&p,(string *)name_00,(string *)name_00,(string *)&err,&local_3d0,
                   (double)(__k->second).x,(double)(__k->second).y,(double)(__k->second).z);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&err);
      }
      else {
        FBX::Node::AddP70vector
                  (&p,(string *)name_00,(double)(__k->second).x,(double)(__k->second).y,
                   (double)(__k->second).z);
      }
    }
  }
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back(&m.children,&p);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"Shading",(allocator<char> *)&local_3d0);
  FBX::FBXExportProperty::FBXExportProperty(&local_190,true);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>(&m,(string *)&err,&local_190);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_190.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&err,"Culling",(allocator<char> *)&local_3d0);
  FBX::FBXExportProperty::FBXExportProperty(&local_1b0,"CullingOff",false);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>(&m,(string *)&err,&local_1b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_1b0.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&err);
  FBX::Node::Dump(&m,local_340,local_384._0_1_,1);
  FBX::Node::~Node(&p);
  std::__cxx11::string::~string((string *)&name);
  FBX::Node::~Node(&m);
  return;
}

Assistant:

void FBXExporter::WriteModelNode(
    StreamWriterLE& outstream,
    bool binary,
    const aiNode* node,
    int64_t node_uid,
    const std::string& type,
    const std::vector<std::pair<std::string,aiVector3D>>& transform_chain,
    TransformInheritance inherit_type
){
    const aiVector3D zero = {0, 0, 0};
    const aiVector3D one = {1, 1, 1};
    FBX::Node m("Model");
    std::string name = node->mName.C_Str() + FBX::SEPARATOR + "Model";
    m.AddProperties(node_uid, name, type);
    m.AddChild("Version", int32_t(232));
    FBX::Node p("Properties70");
    p.AddP70bool("RotationActive", 1);
    p.AddP70int("DefaultAttributeIndex", 0);
    p.AddP70enum("InheritType", inherit_type);
    if (transform_chain.empty()) {
        // decompose 4x4 transform matrix into TRS
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        if (t != zero) {
            p.AddP70(
                "Lcl Translation", "Lcl Translation", "", "A",
                double(t.x), double(t.y), double(t.z)
            );
        }
        if (r != zero) {
            p.AddP70(
                "Lcl Rotation", "Lcl Rotation", "", "A",
                double(DEG*r.x), double(DEG*r.y), double(DEG*r.z)
            );
        }
        if (s != one) {
            p.AddP70(
                "Lcl Scaling", "Lcl Scaling", "", "A",
                double(s.x), double(s.y), double(s.z)
            );
        }
    } else {
        // apply the transformation chain.
        // these transformation elements are created when importing FBX,
        // which has a complex transformation hierarchy for each node.
        // as such we can bake the hierarchy back into the node on export.
        for (auto &item : transform_chain) {
            auto elem = transform_types.find(item.first);
            if (elem == transform_types.end()) {
                // then this is a bug
                std::stringstream err;
                err << "unrecognized FBX transformation type: ";
                err << item.first;
                throw DeadlyExportError(err.str());
            }
            const std::string &name = elem->second.first;
            const aiVector3D &v = item.second;
            if (name.compare(0, 4, "Lcl ") == 0) {
                // special handling for animatable properties
                p.AddP70(
                    name, name, "", "A",
                    double(v.x), double(v.y), double(v.z)
                );
            } else {
                p.AddP70vector(name, v.x, v.y, v.z);
            }
        }
    }
    m.AddChild(p);

    // not sure what these are for,
    // but they seem to be omnipresent
    m.AddChild("Shading", FBXExportProperty(true));
    m.AddChild("Culling", FBXExportProperty("CullingOff"));

    m.Dump(outstream, binary, 1);
}